

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness_sim.c
# Opt level: O0

int Abc_CommandAbcLivenessToSafetySim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  FILE *__stream;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *local_80;
  Vec_Ptr_t *vFair;
  Vec_Ptr_t *vLive;
  Aig_Man_t *pAStack_68;
  int c;
  Aig_Man_t *pAigNew;
  Aig_Man_t *pAig;
  Abc_Ntk_t *pNtkOld;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtkTemp;
  Abc_Ntk_t *pNtk;
  FILE *pErr;
  FILE *pOut;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  Abc_FrameReadOut(pAbc);
  __stream = (FILE *)Abc_FrameReadErr(pAbc);
  if (pAVar2 == (Abc_Ntk_t *)0x0) {
    fprintf(__stream,"Empty network.\n");
    pAbc_local._4_4_ = 1;
  }
  else {
    iVar1 = Abc_NtkIsStrash(pAVar2);
    if (iVar1 == 0) {
      printf("\nThe input network was not strashed, strashing....\n");
      pNtk_00 = Abc_NtkStrash(pAVar2,0,0,0);
      pAigNew = Abc_NtkToDar(pNtk_00,0,1);
      vFair = populateLivenessVector(pAVar2,pAigNew);
      local_80 = populateFairnessVector(pAVar2,pAigNew);
    }
    else {
      pAigNew = Abc_NtkToDar(pAVar2,0,1);
      vFair = populateLivenessVector(pAVar2,pAigNew);
      local_80 = populateFairnessVector(pAVar2,pAigNew);
    }
    iVar1 = Extra_UtilGetopt(argc,argv,"1");
    if (iVar1 == 0x31) {
      pAStack_68 = LivenessToSafetyTransformationOneStepLoopSim(pAVar2,pAigNew,vFair,local_80);
    }
    else {
      pAStack_68 = LivenessToSafetyTransformationSim(pAVar2,pAigNew,vFair,local_80);
    }
    pAVar2 = Abc_NtkFromAigPhase(pAStack_68);
    iVar1 = Abc_NtkCheck(pAVar2);
    if (iVar1 == 0) {
      fprintf(_stdout,"Abc_NtkCreateCone(): Network check has failed.\n");
    }
    updateNewNetworkNameManager(pAVar2,pAStack_68,vecPiNames,vecLoNames);
    Abc_FrameSetCurrentNetwork(pAbc,pAVar2);
    pAbc_local._4_4_ = 0;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandAbcLivenessToSafetySim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pOut, * pErr;
    Abc_Ntk_t * pNtk, * pNtkTemp, *pNtkNew, *pNtkOld;
    Aig_Man_t * pAig, *pAigNew;
    int c;
    Vec_Ptr_t * vLive, * vFair;
                
    pNtk = Abc_FrameReadNtk(pAbc);
    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    if ( pNtk == NULL )
    {
        fprintf( pErr, "Empty network.\n" );
        return 1;
    }

    if( !Abc_NtkIsStrash( pNtk ) )
    {
        printf("\nThe input network was not strashed, strashing....\n");
        pNtkTemp = Abc_NtkStrash( pNtk, 0, 0, 0 );
        pNtkOld = pNtkTemp;
        pAig = Abc_NtkToDar( pNtkTemp, 0, 1 );
        vLive = populateLivenessVector( pNtk, pAig );
        vFair = populateFairnessVector( pNtk, pAig );
    }
    else
    {
        pAig = Abc_NtkToDar( pNtk, 0, 1 );
        pNtkOld = pNtk;
        vLive = populateLivenessVector( pNtk, pAig );
        vFair = populateFairnessVector( pNtk, pAig );
    }

#if 0
    Aig_ManPrintStats( pAig );
    printf("\nDetail statistics*************************************\n");
    printf("Number of true primary inputs = %d\n", Saig_ManPiNum( pAig ));
    printf("Number of true primary outputs = %d\n", Saig_ManPoNum( pAig ));
    printf("Number of true latch outputs = %d\n", Saig_ManCiNum( pAig ) - Saig_ManPiNum( pAig ));
    printf("Number of true latch inputs = %d\n", Saig_ManCoNum( pAig ) - Saig_ManPoNum( pAig ));
    printf("Numer of registers = %d\n", Saig_ManRegNum( pAig ) );
    printf("\n*******************************************************\n");
#endif

    c = Extra_UtilGetopt( argc, argv, "1" );
    if( c == '1' )
        pAigNew = LivenessToSafetyTransformationOneStepLoopSim( pNtk, pAig, vLive, vFair );
    else
        pAigNew = LivenessToSafetyTransformationSim( pNtk, pAig, vLive, vFair );
    
#if 0
    Aig_ManPrintStats( pAigNew );
    printf("\nDetail statistics*************************************\n");
    printf("Number of true primary inputs = %d\n", Saig_ManPiNum( pAigNew ));
    printf("Number of true primary outputs = %d\n", Saig_ManPoNum( pAigNew ));
    printf("Number of true latch outputs = %d\n", Saig_ManCiNum( pAigNew ) - Saig_ManPiNum( pAigNew ));
    printf("Number of true latch inputs = %d\n", Saig_ManCoNum( pAigNew ) - Saig_ManPoNum( pAigNew ));
    printf("Numer of registers = %d\n", Saig_ManRegNum( pAigNew ) );
    printf("\n*******************************************************\n");
#endif

    pNtkNew = Abc_NtkFromAigPhase( pAigNew );

    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkCreateCone(): Network check has failed.\n" );
    
    updateNewNetworkNameManager( pNtkNew, pAigNew, vecPiNames,vecLoNames );
    Abc_FrameSetCurrentNetwork( pAbc, pNtkNew );

    //Saig_ManForEachPi( pAigNew, pObj, i )
    //    printf("Name of %d-th Pi = %s\n", i, retrieveTruePiName( pNtk, pAig, pAigNew, pObj ) );

    //Saig_ManForEachLo( pAigNew, pObj, i )
    //    printf("Name of %d-th Lo = %s\n", i, retrieveLOName( pNtk, pAig, pAigNew, pObj, vLive, vFair ) );

    //printVecPtrOfString( vecPiNames );
    //printVecPtrOfString( vecLoNames );

#if 0
#ifndef DUPLICATE_CKT_DEBUG
    Saig_ManForEachPi( pAigNew, pObj, i )
        assert( strcmp( (char *)Vec_PtrEntry(vecPiNames, i), retrieveTruePiName( pNtk, pAig, pAigNew, pObj ) ) == 0 );
        //printf("Name of %d-th Pi = %s, %s\n", i, retrieveTruePiName( pNtk, pAig, pAigNew, pObj ), (char *)Vec_PtrEntry(vecPiNames, i) );

    Saig_ManForEachLo( pAigNew, pObj, i )
        assert( strcmp( (char *)Vec_PtrEntry(vecLoNames, i), retrieveLOName( pNtk, pAig, pAigNew, pObj, vLive, vFair ) ) == 0 );
#endif    
#endif
        
    return 0;

}